

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

uchar __thiscall
cmsys::SystemInformationImplementation::GetAPICId(SystemInformationImplementation *this)

{
  undefined1 local_28 [7];
  uchar uStack_21;
  int Regs [4];
  SystemInformationImplementation *this_local;
  
  memset(local_28,0,0x10);
  return uStack_21;
}

Assistant:

unsigned char SystemInformationImplementation::GetAPICId()
{
  int Regs[4] = { 0, 0, 0, 0 };

#if USE_CPUID
  if (!this->IsHyperThreadingSupported())
    {
    return static_cast<unsigned char>(-1);  // HT not supported
    } // Logical processor = 1
  call_cpuid(1, Regs);
#endif

  return static_cast<unsigned char>((Regs[1] & INITIAL_APIC_ID_BITS) >> 24);
}